

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarLinux.cpp
# Opt level: O0

void tools::xar::close_non_std_fds(void)

{
  int __fd;
  int iVar1;
  DIR *__dirp;
  dirent *pdStack_20;
  int fd;
  dirent *dent;
  DIR *dir_handle;
  int dir_fd;
  
  __fd = open("/proc/self/fd",0x10000);
  if ((-1 < __fd) && (__dirp = fdopendir(__fd), __dirp != (DIR *)0x0)) {
    pdStack_20 = readdir(__dirp);
    while (pdStack_20 != (dirent *)0x0) {
      iVar1 = strcmp(pdStack_20->d_name,".");
      if ((((iVar1 != 0) && (iVar1 = strcmp(pdStack_20->d_name,".."), iVar1 != 0)) &&
          (iVar1 = atoi(pdStack_20->d_name), iVar1 != __fd)) && (2 < iVar1)) {
        close(iVar1);
      }
      pdStack_20 = readdir(__dirp);
    }
    closedir(__dirp);
  }
  return;
}

Assistant:

void tools::xar::close_non_std_fds() {
  auto dir_fd = open("/proc/self/fd", O_RDONLY | O_DIRECTORY);
  DIR* dir_handle = nullptr;
  if (dir_fd >= 0 && (dir_handle = fdopendir(dir_fd))) {
    for (auto dent = readdir(dir_handle); dent; dent = readdir(dir_handle)) {
      if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
        continue;
      }

      int fd = std::atoi(dent->d_name);
      if (fd != dir_fd && fd > 2) {
        close(fd);
      }
    }
    closedir(dir_handle);
  }
}